

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix
          (SquareMatrix<float> *this,SquareMatrix<float> *matrix)

{
  float fVar1;
  int64_t iVar2;
  float *pfVar3;
  type pfVar4;
  size_t local_38;
  int64_t i;
  float *data;
  SquareMatrix<float> *matrix_local;
  SquareMatrix<float> *this_local;
  
  iVar2 = size(matrix);
  this->size_ = iVar2;
  alloc_unique_array<float>((dense *)&this->data_,this->size_ * this->size_);
  pfVar3 = ptr(matrix);
  for (local_38 = 0; (long)local_38 < this->size_ * this->size_; local_38 = local_38 + 1) {
    fVar1 = pfVar3[local_38];
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->data_,local_38);
    *pfVar4 = fVar1;
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }